

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::inverseDynamicsWithInternalJointForceTorques
          (KinDynComputations *this,Span<const_double,__1L> baseAcc,Span<const_double,__1L> s_ddot,
          LinkNetExternalWrenches *linkExtForces,
          FreeFloatingGeneralizedTorques *baseForceAndJointTorques,
          LinkInternalWrenches *linkInternalWrenches)

{
  long lVar1;
  char *pcVar2;
  VectorDynSize local_80 [32];
  VectorFixSize<6U> local_60;
  
  if (baseAcc.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    lVar1 = iDynTree::Model::getNrOfDOFs();
    if (lVar1 == s_ddot.storage_.super_extent_type<_1L>.size_.size_) {
      VectorFixSize<6U>::VectorFixSize(&local_60,baseAcc.storage_.data_,6);
      iDynTree::VectorDynSize::VectorDynSize
                (local_80,s_ddot.storage_.super_extent_type<_1L>.size_.size_,s_ddot.storage_.data_);
      inverseDynamicsWithInternalJointForceTorques
                (this,&local_60,local_80,linkExtForces,baseForceAndJointTorques,linkInternalWrenches
                );
      iDynTree::VectorDynSize::~VectorDynSize(local_80);
      return true;
    }
    pcVar2 = "Wrong size in input s_ddot";
  }
  else {
    pcVar2 = "Wrong size in input baseAcc";
  }
  iDynTree::reportError("KinDynComputations","inverseDynamicsWithInternalJointForceTorques",pcVar2);
  return false;
}

Assistant:

bool KinDynComputations::inverseDynamicsWithInternalJointForceTorques(iDynTree::Span<const double> baseAcc,
                                                                      iDynTree::Span<const double> s_ddot,
                                                                      const LinkNetExternalWrenches & linkExtForces,
                                                                            FreeFloatingGeneralizedTorques & baseForceAndJointTorques,
                                                                            LinkInternalWrenches& linkInternalWrenches)
{
    constexpr int expected_spatial_acceleration_size = 6;
    bool ok = baseAcc.size() == expected_spatial_acceleration_size;
    if( !ok )
    {
        reportError("KinDynComputations","inverseDynamicsWithInternalJointForceTorques","Wrong size in input baseAcc");
        return false;
    }

    ok = s_ddot.size() == pimpl->m_robot_model.getNrOfDOFs();
    if( !ok )
    {
        reportError("KinDynComputations","inverseDynamicsWithInternalJointForceTorques","Wrong size in input s_ddot");
        return false;
    }


    return this->inverseDynamicsWithInternalJointForceTorques(Vector6(baseAcc),
                                                              VectorDynSize(s_ddot),
                                                              linkExtForces,
                                                              baseForceAndJointTorques,
                                                              linkInternalWrenches);
}